

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_GetInstanceScoped
              (FrameDisplay *pScope,PropertyId propertyId,Var rootObject,Var *thisVar,
              ScriptContext *scriptContext)

{
  uint16 uVar1;
  BOOL BVar2;
  int iVar3;
  RecyclableObject *pRVar4;
  undefined4 extraout_var;
  JavascriptLibrary *this;
  GlobalObject *pGVar5;
  RecyclableObject *obj;
  int length;
  int i;
  ScriptContext *scriptContext_local;
  Var *thisVar_local;
  Var rootObject_local;
  PropertyId propertyId_local;
  FrameDisplay *pScope_local;
  
  uVar1 = FrameDisplay::GetLength(pScope);
  obj._4_4_ = 0;
  while( true ) {
    if ((int)(uint)uVar1 <= (int)obj._4_4_) {
      this = ScriptContext::GetLibrary(scriptContext);
      pRVar4 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      *thisVar = pRVar4;
      pGVar5 = ScriptContextBase::GetGlobalObject(&scriptContext->super_ScriptContextBase);
      if (((GlobalObject *)rootObject == pGVar5) ||
         (BVar2 = OP_HasProperty(rootObject,propertyId,scriptContext),
         pScope_local = (FrameDisplay *)rootObject, BVar2 == 0)) {
        pScope_local = (FrameDisplay *)
                       ScriptContextBase::GetGlobalObject(&scriptContext->super_ScriptContextBase);
      }
      return pScope_local;
    }
    pRVar4 = (RecyclableObject *)FrameDisplay::GetItem(pScope,obj._4_4_);
    BVar2 = HasProperty(pRVar4,propertyId);
    if (BVar2 != 0) break;
    obj._4_4_ = obj._4_4_ + 1;
  }
  iVar3 = (*(pRVar4->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x42])(pRVar4,thisVar);
  return (Var)CONCAT44(extraout_var,iVar3);
}

Assistant:

Var JavascriptOperators::OP_GetInstanceScoped(FrameDisplay *pScope, PropertyId propertyId, Var rootObject, Var* thisVar, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_GetInstanceScoped);
        // Similar to GetPropertyScoped, but instead of returning the property value, we return the instance that
        // owns it, or the global object if no instance is found.

        int i;
        int length = pScope->GetLength();

        for (i = 0; i < length; i++)
        {
            RecyclableObject *obj = (RecyclableObject*)pScope->GetItem(i);

            if (JavascriptOperators::HasProperty(obj, propertyId))
            {
                // HasProperty will call UnscopablesWrapperObject's HasProperty which will do the filtering
                // All we have to do here is unwrap the object hence the api call

                return obj->GetThisAndUnwrappedInstance(thisVar);
            }
        }

        *thisVar = scriptContext->GetLibrary()->GetUndefined();
        if (rootObject != scriptContext->GetGlobalObject())
        {
            if (JavascriptOperators::OP_HasProperty(rootObject, propertyId, scriptContext))
            {
                return rootObject;
            }
        }

        return scriptContext->GetGlobalObject();
        JIT_HELPER_END(Op_GetInstanceScoped);
    }